

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O0

size_t ZSTD_estimateSubBlockSize_sequences
                 (BYTE *ofCodeTable,BYTE *llCodeTable,BYTE *mlCodeTable,size_t nbSeq,
                 ZSTD_fseCTables_t *fseTables,ZSTD_fseCTablesMetadata_t *fseMetadata,void *workspace
                 ,size_t wkspSize,int writeEntropy)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long local_50;
  size_t cSeqSizeEstimate;
  size_t sequencesSectionHeaderSize;
  ZSTD_fseCTablesMetadata_t *fseMetadata_local;
  ZSTD_fseCTables_t *fseTables_local;
  size_t nbSeq_local;
  BYTE *mlCodeTable_local;
  BYTE *llCodeTable_local;
  BYTE *ofCodeTable_local;
  
  if (nbSeq == 0) {
    ofCodeTable_local = (BYTE *)0x3;
  }
  else {
    sVar1 = ZSTD_estimateSubBlockSize_symbolType
                      (fseMetadata->ofType,ofCodeTable,0x1f,nbSeq,fseTables->offcodeCTable,(U8 *)0x0
                       ,OF_defaultNorm,5,0x1c,workspace,wkspSize);
    sVar2 = ZSTD_estimateSubBlockSize_symbolType
                      (fseMetadata->llType,llCodeTable,0x23,nbSeq,fseTables->litlengthCTable,"",
                       LL_defaultNorm,6,0x23,workspace,wkspSize);
    sVar3 = ZSTD_estimateSubBlockSize_symbolType
                      (fseMetadata->mlType,mlCodeTable,0x34,nbSeq,fseTables->matchlengthCTable,"",
                       ML_defaultNorm,6,0x34,workspace,wkspSize);
    local_50 = sVar3 + sVar2 + sVar1;
    if (writeEntropy != 0) {
      local_50 = fseMetadata->fseTablesSize + local_50;
    }
    ofCodeTable_local = (BYTE *)(local_50 + 3);
  }
  return (size_t)ofCodeTable_local;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize_sequences(const BYTE* ofCodeTable,
                                                  const BYTE* llCodeTable,
                                                  const BYTE* mlCodeTable,
                                                  size_t nbSeq,
                                                  const ZSTD_fseCTables_t* fseTables,
                                                  const ZSTD_fseCTablesMetadata_t* fseMetadata,
                                                  void* workspace, size_t wkspSize,
                                                  int writeEntropy)
{
    size_t const sequencesSectionHeaderSize = 3; /* Use hard coded size of 3 bytes */
    size_t cSeqSizeEstimate = 0;
    if (nbSeq == 0) return sequencesSectionHeaderSize;
    cSeqSizeEstimate += ZSTD_estimateSubBlockSize_symbolType(fseMetadata->ofType, ofCodeTable, MaxOff,
                                         nbSeq, fseTables->offcodeCTable, NULL,
                                         OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                                         workspace, wkspSize);
    cSeqSizeEstimate += ZSTD_estimateSubBlockSize_symbolType(fseMetadata->llType, llCodeTable, MaxLL,
                                         nbSeq, fseTables->litlengthCTable, LL_bits,
                                         LL_defaultNorm, LL_defaultNormLog, MaxLL,
                                         workspace, wkspSize);
    cSeqSizeEstimate += ZSTD_estimateSubBlockSize_symbolType(fseMetadata->mlType, mlCodeTable, MaxML,
                                         nbSeq, fseTables->matchlengthCTable, ML_bits,
                                         ML_defaultNorm, ML_defaultNormLog, MaxML,
                                         workspace, wkspSize);
    if (writeEntropy) cSeqSizeEstimate += fseMetadata->fseTablesSize;
    return cSeqSizeEstimate + sequencesSectionHeaderSize;
}